

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::VertexTextureTests::init(VertexTextureTests *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  GLenum GVar2;
  undefined4 uVar3;
  Context *pCVar4;
  TestNode *pTVar5;
  TestNode *this_00;
  TestNode *pTVar6;
  TestNode *pTVar7;
  long *plVar8;
  long lVar9;
  long *extraout_RAX;
  long *plVar10;
  long lVar11;
  VertexTextureTests *pVVar12;
  string name;
  long local_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  VertexTextureTests *local_b8;
  anon_struct_16_2_3f8b7511 *local_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  TestNode *local_88;
  anon_struct_16_2_3f8b7511 *local_80;
  long *local_78 [2];
  long local_68 [2];
  TestNode *local_58;
  long local_50;
  TestNode *local_48;
  long local_40;
  TestNode *local_38;
  
  pTVar5 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pCVar4->m_testCtx,"2d","2D Vertex Texture Tests");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
  pTVar5[1]._vptr_TestNode = (_func_int **)pCVar4;
  this_00 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_00,pCVar4->m_testCtx,"cube","Cube Map Vertex Texture Tests");
  this_00->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
  this_00[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar6 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pCVar4->m_testCtx,"filtering",
             "2D Vertex Texture Filtering Tests");
  ((TestNode *)&pTVar6->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
  ((TestNode *)&pTVar6[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar4;
  pTVar7 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pCVar4->m_testCtx,"wrap","2D Vertex Texture Wrap Tests");
  ((TestNode *)&pTVar7->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
  ((TestNode *)&pTVar7[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar4;
  local_88 = pTVar6;
  local_58 = pTVar7;
  pTVar6 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pCVar4->m_testCtx,"filtering",
             "Cube Map Vertex Texture Filtering Tests");
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar7 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pCVar4->m_testCtx,"wrap","Cube Map Vertex Texture Wrap Tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
  pTVar7[1]._vptr_TestNode = (_func_int **)pCVar4;
  tcu::TestNode::addChild(pTVar5,local_88);
  tcu::TestNode::addChild(pTVar5,local_58);
  local_38 = pTVar6;
  tcu::TestNode::addChild(this_00,pTVar6);
  local_48 = pTVar7;
  tcu::TestNode::addChild(this_00,pTVar7);
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  tcu::TestNode::addChild((TestNode *)this,this_00);
  lVar9 = 0;
  local_b8 = this;
  do {
    local_80 = init::minFilterModes + lVar9;
    lVar11 = 0;
    local_50 = lVar9;
    do {
      local_b0 = init::magFilterModes + lVar11;
      local_140 = 8;
      local_40 = lVar11;
      do {
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_78,0x1b32ab9);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_78);
        local_a8 = &local_98;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_98 = *plVar10;
          lStack_90 = plVar8[3];
        }
        else {
          local_98 = *plVar10;
          local_a8 = (long *)*plVar8;
        }
        local_a0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_a8);
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_108 = *plVar10;
          lStack_100 = plVar8[3];
          local_118 = &local_108;
        }
        else {
          local_108 = *plVar10;
          local_118 = (long *)*plVar8;
        }
        local_110 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_128 = *plVar10;
          lStack_120 = plVar8[3];
          local_138 = &local_128;
        }
        else {
          local_128 = *plVar10;
          local_138 = (long *)*plVar8;
        }
        local_130 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_138);
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_c8 = *plVar10;
          lStack_c0 = plVar8[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *plVar10;
          local_d8 = (long *)*plVar8;
        }
        local_d0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_f8 = &local_e8;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_e8 = *plVar10;
          lStack_e0 = plVar8[3];
        }
        else {
          local_e8 = *plVar10;
          local_f8 = (long *)*plVar8;
        }
        local_f0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if (local_138 != &local_128) {
          operator_delete(local_138,local_128 + 1);
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if (local_a8 != &local_98) {
          operator_delete(local_a8,local_98 + 1);
        }
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
        pTVar5 = (TestNode *)operator_new(0xa0);
        pCVar4 = (this->super_TestCaseGroup).m_context;
        GVar1 = local_80->mode;
        GVar2 = local_b0->mode;
        uVar3 = *(undefined4 *)((long)&init::wrapModes[0].name + local_140);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar5,pCVar4->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_f8,
                   glcts::fixed_sample_locations_values + 1);
        pTVar5[1]._vptr_TestNode = (_func_int **)pCVar4;
        pTVar5->_vptr_TestNode = (_func_int **)&PTR__Vertex2DTextureCase_02168b70;
        *(GLenum *)&pTVar5[1].m_testCtx = GVar1;
        *(GLenum *)((long)&pTVar5[1].m_testCtx + 4) = GVar2;
        *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = uVar3;
        *(undefined4 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = uVar3;
        pTVar5[1].m_name._M_string_length = 0;
        pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
        tcu::TestNode::addChild(local_88,pTVar5);
        this = local_b8;
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        local_140 = local_140 + 0x10;
      } while (local_140 != 0x38);
      lVar11 = local_40 + 1;
    } while (local_40 == 0);
    lVar9 = local_50 + 1;
  } while (lVar9 != 6);
  lVar9 = 0;
  do {
    lVar11 = 8;
    do {
      local_118 = &local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,0x1b32ab9);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
      local_138 = &local_128;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_128 = *plVar10;
        lStack_120 = plVar8[3];
      }
      else {
        local_128 = *plVar10;
        local_138 = (long *)*plVar8;
      }
      local_130 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_138);
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_c8 = *plVar10;
        lStack_c0 = plVar8[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar10;
        local_d8 = (long *)*plVar8;
      }
      local_d0 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_f8 = &local_e8;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_e8 = *plVar10;
        lStack_e0 = plVar8[3];
      }
      else {
        local_e8 = *plVar10;
        local_f8 = (long *)*plVar8;
      }
      local_f0 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,local_128 + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      pTVar5 = (TestNode *)operator_new(0xa0);
      pCVar4 = (local_b8->super_TestCaseGroup).m_context;
      GVar1 = init::wrapModes[lVar9].mode;
      uVar3 = *(undefined4 *)((long)&init::wrapModes[0].name + lVar11);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,pCVar4->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_f8,
                 glcts::fixed_sample_locations_values + 1);
      pTVar5[1]._vptr_TestNode = (_func_int **)pCVar4;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__Vertex2DTextureCase_02168b70;
      pTVar5[1].m_testCtx = (TestContext *)0x260100002703;
      *(GLenum *)&pTVar5[1].m_name._M_dataplus._M_p = GVar1;
      *(undefined4 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = uVar3;
      pTVar5[1].m_name._M_string_length = 0;
      pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
      tcu::TestNode::addChild(local_58,pTVar5);
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x38);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  lVar9 = 0;
  pVVar12 = local_b8;
  do {
    lVar11 = 0;
    local_88 = (TestNode *)lVar9;
    do {
      local_b0 = init::magFilterModes + lVar11;
      local_140 = 8;
      local_80 = (anon_struct_16_2_3f8b7511 *)lVar11;
      do {
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_78,0x1b32ab9);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_78);
        local_a8 = &local_98;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_98 = *plVar10;
          lStack_90 = plVar8[3];
        }
        else {
          local_98 = *plVar10;
          local_a8 = (long *)*plVar8;
        }
        local_a0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_a8);
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_108 = *plVar10;
          lStack_100 = plVar8[3];
          local_118 = &local_108;
        }
        else {
          local_108 = *plVar10;
          local_118 = (long *)*plVar8;
        }
        local_110 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_128 = *plVar10;
          lStack_120 = plVar8[3];
          local_138 = &local_128;
        }
        else {
          local_128 = *plVar10;
          local_138 = (long *)*plVar8;
        }
        local_130 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_138);
        local_d8 = &local_c8;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_c8 = *plVar10;
          lStack_c0 = plVar8[3];
        }
        else {
          local_c8 = *plVar10;
          local_d8 = (long *)*plVar8;
        }
        local_d0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_f8 = &local_e8;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_e8 = *plVar10;
          lStack_e0 = plVar8[3];
        }
        else {
          local_e8 = *plVar10;
          local_f8 = (long *)*plVar8;
        }
        local_f0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if (local_138 != &local_128) {
          operator_delete(local_138,local_128 + 1);
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if (local_a8 != &local_98) {
          operator_delete(local_a8,local_98 + 1);
        }
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
        pTVar5 = (TestNode *)operator_new(0xa0);
        pCVar4 = (pVVar12->super_TestCaseGroup).m_context;
        GVar1 = init::minFilterModes[lVar9].mode;
        GVar2 = local_b0->mode;
        uVar3 = *(undefined4 *)((long)&init::wrapModes[0].name + local_140);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar5,pCVar4->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_f8,
                   glcts::fixed_sample_locations_values + 1);
        pTVar5[1]._vptr_TestNode = (_func_int **)pCVar4;
        pTVar5->_vptr_TestNode = (_func_int **)&PTR__VertexCubeTextureCase_02168ba8;
        *(GLenum *)&pTVar5[1].m_testCtx = GVar1;
        *(GLenum *)((long)&pTVar5[1].m_testCtx + 4) = GVar2;
        *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = uVar3;
        *(undefined4 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = uVar3;
        pTVar5[1].m_name._M_string_length = 0;
        pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
        tcu::TestNode::addChild(local_38,pTVar5);
        pVVar12 = local_b8;
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        local_140 = local_140 + 0x10;
      } while (local_140 != 0x38);
      lVar11 = (long)local_80 + 1;
    } while (local_80 == (anon_struct_16_2_3f8b7511 *)0x0);
    lVar9 = (long)local_88 + 1;
  } while (lVar9 != 6);
  lVar9 = 0;
  do {
    lVar11 = 8;
    do {
      local_118 = &local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,0x1b32ab9);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
      local_138 = &local_128;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_128 = *plVar10;
        lStack_120 = plVar8[3];
      }
      else {
        local_128 = *plVar10;
        local_138 = (long *)*plVar8;
      }
      local_130 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_138);
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_c8 = *plVar10;
        lStack_c0 = plVar8[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar10;
        local_d8 = (long *)*plVar8;
      }
      local_d0 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_f8 = &local_e8;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_e8 = *plVar10;
        lStack_e0 = plVar8[3];
      }
      else {
        local_e8 = *plVar10;
        local_f8 = (long *)*plVar8;
      }
      local_f0 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,local_128 + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      pTVar5 = (TestNode *)operator_new(0xa0);
      pCVar4 = (local_b8->super_TestCaseGroup).m_context;
      GVar1 = init::wrapModes[lVar9].mode;
      uVar3 = *(undefined4 *)((long)&init::wrapModes[0].name + lVar11);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,pCVar4->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_f8,
                 glcts::fixed_sample_locations_values + 1);
      pTVar5[1]._vptr_TestNode = (_func_int **)pCVar4;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__VertexCubeTextureCase_02168ba8;
      pTVar5[1].m_testCtx = (TestContext *)0x260100002703;
      *(GLenum *)&pTVar5[1].m_name._M_dataplus._M_p = GVar1;
      *(undefined4 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = uVar3;
      pTVar5[1].m_name._M_string_length = 0;
      pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
      tcu::TestNode::addChild(local_48,pTVar5);
      plVar8 = &local_e8;
      if (local_f8 != plVar8) {
        operator_delete(local_f8,local_e8 + 1);
        plVar8 = extraout_RAX;
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x38);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  return (int)plVar8;
}

Assistant:

void VertexTextureTests::init (void)
{
	// 2D and cube map groups, and their filtering and wrap sub-groups.
	TestCaseGroup* const group2D				= new TestCaseGroup(m_context, "2d",			"2D Vertex Texture Tests");
	TestCaseGroup* const groupCube				= new TestCaseGroup(m_context, "cube",			"Cube Map Vertex Texture Tests");
	TestCaseGroup* const filteringGroup2D		= new TestCaseGroup(m_context, "filtering",		"2D Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroup2D			= new TestCaseGroup(m_context, "wrap",			"2D Vertex Texture Wrap Tests");
	TestCaseGroup* const filteringGroupCube		= new TestCaseGroup(m_context, "filtering",		"Cube Map Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroupCube			= new TestCaseGroup(m_context, "wrap",			"Cube Map Vertex Texture Wrap Tests");

	group2D->addChild(filteringGroup2D);
	group2D->addChild(wrapGroup2D);
	groupCube->addChild(filteringGroupCube);
	groupCube->addChild(wrapGroupCube);

	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE	},
		{ "repeat",		GL_REPEAT			},
		{ "mirror",		GL_MIRRORED_REPEAT	}
	};

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST	},
		{ "linear",		GL_LINEAR	}
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// 2D cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroup2D->addChild(new Vertex2DTextureCase(m_context,
															   name.c_str(), "",
															   minFilterModes[minFilter].mode,
															   magFilterModes[magFilter].mode,
															   wrapModes[wrapMode].mode,
															   wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name;

			wrapGroup2D->addChild(new Vertex2DTextureCase(m_context,
														  name.c_str(), "",
														  GL_LINEAR_MIPMAP_LINEAR,
														  GL_LINEAR,
														  wrapModes[wrapSMode].mode,
														  wrapModes[wrapTMode].mode));
		}));

	// Cube map cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroupCube->addChild(new VertexCubeTextureCase(m_context,
																   name.c_str(), "",
																   minFilterModes[minFilter].mode,
																   magFilterModes[magFilter].mode,
																   wrapModes[wrapMode].mode,
																   wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name;

			wrapGroupCube->addChild(new VertexCubeTextureCase(m_context,
															  name.c_str(), "",
															  GL_LINEAR_MIPMAP_LINEAR,
															  GL_LINEAR,
															  wrapModes[wrapSMode].mode,
															  wrapModes[wrapTMode].mode));
		}));
}